

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldebug.c
# Opt level: O2

char * getobjname(Proto *p,int lastpc,int reg,char **name)

{
  uint i;
  int pc;
  char *pcVar1;
  int isup;
  ulong uVar2;
  int lastpc_local;
  
  lastpc_local = lastpc;
  pcVar1 = basicgetobjname(p,&lastpc_local,reg,name);
  pc = lastpc_local;
  if (pcVar1 != (char *)0x0) {
    return pcVar1;
  }
  if ((long)lastpc_local == -1) {
    return (char *)0x0;
  }
  i = p->code[lastpc_local];
  pcVar1 = (char *)0x0;
  switch(i & 0x7f) {
  case 0xb:
    uVar2 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar2] & 0xf) == 4) {
      pcVar1 = (char *)(*(long *)((long)&p->k->value_ + uVar2) + 0x18);
    }
    else {
      pcVar1 = "?";
    }
    *name = pcVar1;
    isup = 1;
    goto LAB_00108d95;
  case 0xc:
    rname(p,lastpc_local,i >> 0x18,name);
    goto LAB_00108d8a;
  case 0xd:
    *name = "integer index";
    pcVar1 = "field";
    break;
  case 0xe:
    uVar2 = (ulong)(i >> 0x14 & 0xfffffff0);
    if (((&p->k->tt_)[uVar2] & 0xf) == 4) {
      pcVar1 = (char *)(*(long *)((long)&p->k->value_ + uVar2) + 0x18);
    }
    else {
      pcVar1 = "?";
    }
    *name = pcVar1;
LAB_00108d8a:
    isup = 0;
LAB_00108d95:
    pcVar1 = isEnv(p,pc,i,isup);
    return pcVar1;
  case 0x14:
    if ((short)i < 0) {
      uVar2 = (ulong)((i >> 0x18) << 4);
      if (((&p->k->tt_)[uVar2] & 0xf) == 4) {
        pcVar1 = (char *)(*(long *)((long)&p->k->value_ + uVar2) + 0x18);
      }
      else {
        pcVar1 = "?";
      }
      *name = pcVar1;
    }
    else {
      rname(p,lastpc_local,i >> 0x18,name);
    }
    pcVar1 = "method";
  }
  return pcVar1;
}

Assistant:

static const char *getobjname (const Proto *p, int lastpc, int reg,
                               const char **name) {
  const char *kind = basicgetobjname(p, &lastpc, reg, name);
  if (kind != NULL)
    return kind;
  else if (lastpc != -1) {  /* could find instruction? */
    Instruction i = p->code[lastpc];
    OpCode op = GET_OPCODE(i);
    switch (op) {
      case OP_GETTABUP: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 1);
      }
      case OP_GETTABLE: {
        int k = GETARG_C(i);  /* key index */
        rname(p, lastpc, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_GETI: {
        *name = "integer index";
        return "field";
      }
      case OP_GETFIELD: {
        int k = GETARG_C(i);  /* key index */
        kname(p, k, name);
        return isEnv(p, lastpc, i, 0);
      }
      case OP_SELF: {
        rkname(p, lastpc, i, name);
        return "method";
      }
      default: break;  /* go through to return NULL */
    }
  }
  return NULL;  /* could not find reasonable name */
}